

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageColorBrightness(Image *image,int brightness)

{
  int iVar1;
  uint uVar2;
  uchar uVar3;
  Image image_00;
  Color *pCVar4;
  uchar *puVar5;
  uchar uVar6;
  int iVar7;
  undefined8 unaff_RBX;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined8 unaff_R12;
  int iVar14;
  undefined8 unaff_R13;
  int iVar15;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    iVar8 = -0xff;
    if (-0xff < brightness) {
      iVar8 = brightness;
    }
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
    image_00._8_8_ = unaff_R12;
    image_00.data = (void *)unaff_RBX;
    image_00._16_8_ = unaff_R13;
    pCVar4 = LoadImageColors(image_00);
    iVar1 = image->height;
    if (0 < (long)iVar1) {
      uVar2 = image->width;
      puVar5 = &pCVar4->b;
      lVar9 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar10 = 0;
          do {
            iVar11 = (uint)puVar5[uVar10 * 4 + -2] + iVar8;
            iVar12 = (uint)puVar5[uVar10 * 4 + -1] + iVar8;
            iVar13 = (uint)puVar5[uVar10 * 4] + iVar8;
            iVar14 = 0xff;
            if (iVar11 < 0xff) {
              iVar14 = iVar11;
            }
            iVar15 = 0xff;
            if (iVar12 < 0xff) {
              iVar15 = iVar12;
            }
            iVar7 = 0xff;
            if (iVar13 < 0xff) {
              iVar7 = iVar13;
            }
            uVar6 = (uchar)iVar14;
            if (iVar11 < 0) {
              uVar6 = '\x01';
            }
            uVar3 = (uchar)iVar15;
            if (iVar12 < 0) {
              uVar3 = '\x01';
            }
            puVar5[uVar10 * 4 + -2] = uVar6;
            uVar6 = (uchar)iVar7;
            if (iVar13 < 0) {
              uVar6 = '\x01';
            }
            puVar5[uVar10 * 4 + -1] = uVar3;
            puVar5[uVar10 * 4] = uVar6;
            uVar10 = uVar10 + 1;
          } while (uVar2 != uVar10);
        }
        lVar9 = lVar9 + 1;
        puVar5 = puVar5 + (ulong)uVar2 * 4;
      } while (lVar9 != iVar1);
    }
    iVar8 = image->format;
    free(image->data);
    image->data = pCVar4;
    image->format = 7;
    ImageFormat(image,iVar8);
    return;
  }
  return;
}

Assistant:

void ImageColorBrightness(Image *image, int brightness)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (brightness < -255) brightness = -255;
    if (brightness > 255) brightness = 255;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            int cR = pixels[y*image->width + x].r + brightness;
            int cG = pixels[y*image->width + x].g + brightness;
            int cB = pixels[y*image->width + x].b + brightness;

            if (cR < 0) cR = 1;
            if (cR > 255) cR = 255;

            if (cG < 0) cG = 1;
            if (cG > 255) cG = 255;

            if (cB < 0) cB = 1;
            if (cB > 255) cB = 255;

            pixels[y*image->width + x].r = (unsigned char)cR;
            pixels[y*image->width + x].g = (unsigned char)cG;
            pixels[y*image->width + x].b = (unsigned char)cB;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}